

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O1

ssize_t amqp_ssl_socket_writev(void *base,iovec *iov,int iovcnt)

{
  void *pvVar1;
  ssize_t sVar2;
  long lVar3;
  ulong __size;
  
  if (iovcnt < 1) {
    __size = 0;
  }
  else {
    lVar3 = 0;
    __size = 0;
    do {
      __size = __size + *(long *)((long)&iov->iov_len + lVar3);
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(uint)iovcnt << 4 != lVar3);
  }
  if (*(ulong *)((long)base + 0x28) < __size) {
    pvVar1 = realloc(*(void **)((long)base + 0x20),__size);
    *(void **)((long)base + 0x20) = pvVar1;
    if (pvVar1 == (void *)0x0) {
      *(undefined8 *)((long)base + 0x28) = 0;
      return -1;
    }
    *(ulong *)((long)base + 0x28) = __size;
  }
  if (0 < iovcnt) {
    pvVar1 = *(void **)((long)base + 0x20);
    lVar3 = 0;
    do {
      memcpy(pvVar1,*(void **)((long)&iov->iov_base + lVar3),
             *(size_t *)((long)&iov->iov_len + lVar3));
      pvVar1 = (void *)((long)pvVar1 + *(long *)((long)&iov->iov_len + lVar3));
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(uint)iovcnt << 4 != lVar3);
  }
  sVar2 = amqp_ssl_socket_send(base,*(void **)((long)base + 0x20),__size);
  return sVar2;
}

Assistant:

static ssize_t
amqp_ssl_socket_writev(void *base,
                       struct iovec *iov,
                       int iovcnt)
{
  struct amqp_ssl_socket_t *self = (struct amqp_ssl_socket_t *)base;
  ssize_t ret = -1;
  char *bufferp;
  size_t bytes;
  int i;
  bytes = 0;
  for (i = 0; i < iovcnt; ++i) {
    bytes += iov[i].iov_len;
  }
  if (self->length < bytes) {
    self->buffer = realloc(self->buffer, bytes);
    if (!self->buffer) {
      self->length = 0;
      ret = AMQP_STATUS_NO_MEMORY;
      goto exit;
    }
    self->length = bytes;
  }
  bufferp = self->buffer;
  for (i = 0; i < iovcnt; ++i) {
    memcpy(bufferp, iov[i].iov_base, iov[i].iov_len);
    bufferp += iov[i].iov_len;
  }
  ret = amqp_ssl_socket_send(self, self->buffer, bytes);
exit:
  return ret;
}